

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_debug_line_section.hpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::
debug_line_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::debug_line_section
          (debug_line_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
           *this,not_null<context_*> ctxt,section_kind kind,not_null<const_string_mapping_*> names,
          section_content *content,
          back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
          *out)

{
  not_null<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>_>_>_*>
  local_58;
  not_null<repo::section_content_*> local_50;
  not_null<const_string_mapping_*> local_48;
  not_null<context_*> local_40;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *local_38;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *out_local;
  section_content *content_local;
  debug_line_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *pdStack_20;
  section_kind kind_local;
  debug_line_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *this_local;
  not_null<const_string_mapping_*> names_local;
  not_null<context_*> ctxt_local;
  
  local_48.ptr_ = names.ptr_;
  local_40.ptr_ = ctxt.ptr_;
  local_38 = out;
  out_local = (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
               *)content;
  content_local._7_1_ = kind;
  pdStack_20 = this;
  this_local = (debug_line_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                *)names.ptr_;
  names_local.ptr_ = (string_mapping *)ctxt.ptr_;
  gsl::not_null<pstore::repo::section_content_*>::not_null(&local_50,content);
  gsl::
  not_null<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>
  ::not_null(&local_58,local_38);
  generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  ::generic_section(&this->
                     super_generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                    ,local_40,kind,local_48,local_50,local_58);
  (this->
  super_generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  ).super_rule._vptr_rule = (_func_int **)&PTR__debug_line_section_002396a8;
  std::bitset<1UL>::bitset(&this->seen_);
  std::__cxx11::string::string((string *)&this->header_digest_);
  gsl::
  not_null<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>
  ::not_null(&this->out_,local_38);
  if (content_local._7_1_ == debug_line) {
    return;
  }
  assert_failed("kind == repo::section_kind::debug_line",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/import_debug_line_section.hpp"
                ,0x2f);
}

Assistant:

debug_line_section (not_null<context *> const ctxt, repo::section_kind kind,
                                    not_null<string_mapping const *> const names,
                                    repo::section_content * const content,
                                    OutputIterator * const out)
                        : generic_section<OutputIterator> (ctxt, kind, names, content, out)
                        , out_{out} {
                    PSTORE_ASSERT (kind == repo::section_kind::debug_line);
                }